

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoluj.c
# Opt level: O0

int fffr4u4(float *input,long ntodo,double scale,double zero,int nullcheck,unsigned_long nullval,
           char *nullarray,int *anynull,unsigned_long *output,int *status)

{
  short sVar1;
  ulong uVar2;
  double dVar3;
  short iret;
  short *sptr;
  double dvalue;
  long ii;
  int *anynull_local;
  char *nullarray_local;
  unsigned_long nullval_local;
  int nullcheck_local;
  double zero_local;
  double scale_local;
  long ntodo_local;
  float *input_local;
  
  if (nullcheck == 0) {
    if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
      for (ii = 0; ii < ntodo; ii = ii + 1) {
        dVar3 = (double)input[ii] * scale + zero;
        if (-0.49 <= dVar3) {
          if (dVar3 <= 1.844674407370955e+19) {
            output[ii] = (long)dVar3 | (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f;
          }
          else {
            *status = -0xb;
            output[ii] = 0xffffffffffffffff;
          }
        }
        else {
          *status = -0xb;
          output[ii] = 0;
        }
      }
    }
    else {
      for (ii = 0; ii < ntodo; ii = ii + 1) {
        if (-0.49 <= input[ii]) {
          if (input[ii] <= 1.8446744e+19) {
            uVar2 = (ulong)input[ii];
            output[ii] = uVar2 | (long)(input[ii] - 9.223372e+18) & (long)uVar2 >> 0x3f;
          }
          else {
            *status = -0xb;
            output[ii] = 0xffffffffffffffff;
          }
        }
        else {
          *status = -0xb;
          output[ii] = 0;
        }
      }
    }
  }
  else {
    sptr = (short *)((long)input + 2);
    if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
      for (ii = 0; ii < ntodo; ii = ii + 1) {
        if ((*sptr & 0x7f80U) == 0x7f80) {
          sVar1 = 1;
        }
        else {
          sVar1 = 0;
          if ((*sptr & 0x7f80U) == 0) {
            sVar1 = 2;
          }
        }
        if (sVar1 == 0) {
          dVar3 = (double)input[ii] * scale + zero;
          if (-0.49 <= dVar3) {
            if (dVar3 <= 1.844674407370955e+19) {
              output[ii] = (long)dVar3 | (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f
              ;
            }
            else {
              *status = -0xb;
              output[ii] = 0xffffffffffffffff;
            }
          }
          else {
            *status = -0xb;
            output[ii] = 0;
          }
        }
        else if (sVar1 == 1) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[ii] = nullval;
          }
          else {
            nullarray[ii] = '\x01';
          }
        }
        else if (-0.49 <= zero) {
          if (zero <= 1.844674407370955e+19) {
            output[ii] = (long)zero | (long)(zero - 9.223372036854776e+18) & (long)zero >> 0x3f;
          }
          else {
            *status = -0xb;
            output[ii] = 0xffffffffffffffff;
          }
        }
        else {
          *status = -0xb;
          output[ii] = 0;
        }
        sptr = sptr + 2;
      }
    }
    else {
      for (ii = 0; ii < ntodo; ii = ii + 1) {
        if ((*sptr & 0x7f80U) == 0x7f80) {
          sVar1 = 1;
        }
        else {
          sVar1 = 0;
          if ((*sptr & 0x7f80U) == 0) {
            sVar1 = 2;
          }
        }
        if (sVar1 == 0) {
          if (-0.49 <= input[ii]) {
            if (input[ii] <= 1.8446744e+19) {
              uVar2 = (ulong)input[ii];
              output[ii] = uVar2 | (long)(input[ii] - 9.223372e+18) & (long)uVar2 >> 0x3f;
            }
            else {
              *status = -0xb;
              output[ii] = 0xffffffffffffffff;
            }
          }
          else {
            *status = -0xb;
            output[ii] = 0;
          }
        }
        else if (sVar1 == 1) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[ii] = nullval;
          }
          else {
            nullarray[ii] = '\x01';
          }
        }
        else {
          output[ii] = 0;
        }
        sptr = sptr + 2;
      }
    }
  }
  return *status;
}

Assistant:

int fffr4u4(float *input,         /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
   unsigned long nullval,         /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
   unsigned long *output,         /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to NaN.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;
    short *sptr, iret;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] < DULONG_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else if (input[ii] > DULONG_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = ULONG_MAX;
                }
                else
                    output[ii] = (unsigned long) input[ii];
            }
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DULONG_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else if (dvalue > DULONG_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = ULONG_MAX;
                }
                else
                    output[ii] = (unsigned long) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        sptr = (short *) input;

#if BYTESWAPPED && MACHINE != VAXVMS && MACHINE != ALPHAVMS
        sptr++;       /* point to MSBs */
#endif

        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++, sptr += 2)
            {
              if (0 != (iret = fnan(*sptr) ) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                  }
                  else            /* it's an underflow */
                     output[ii] = 0;
              }
              else
                {
                    if (input[ii] < DULONG_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (input[ii] > DULONG_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = ULONG_MAX;
                    }
                    else
                        output[ii] = (unsigned long) input[ii];
                }
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++, sptr += 2)
            {
              if (0 != (iret = fnan(*sptr) ) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {  
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                  }
                  else            /* it's an underflow */
                  { 
                    if (zero < DULONG_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (zero > DULONG_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = ULONG_MAX;
                    }
                    else
                      output[ii] = (unsigned long) zero;
                  }
              }
              else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DULONG_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (dvalue > DULONG_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = ULONG_MAX;
                    }
                    else
                        output[ii] = (unsigned long) dvalue;
                }
            }
        }
    }
    return(*status);
}